

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O0

void save_objects(FILE *fp,AREA_DATA_conflict *pArea)

{
  long in_RSI;
  FILE *in_RDI;
  int i;
  OBJ_INDEX_DATA *pObj;
  OBJ_INDEX_DATA *in_stack_000001a8;
  FILE *in_stack_000001b0;
  int local_1c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffffe8;
  
  fprintf(in_RDI,"#OBJS\n");
  for (local_1c = (int)*(short *)(in_RSI + 0x58); local_1c <= *(short *)(in_RSI + 0x5a);
      local_1c = local_1c + 1) {
    in_stack_ffffffffffffffe8 = get_obj_index((int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    if (in_stack_ffffffffffffffe8 != (OBJ_INDEX_DATA *)0x0) {
      save_object(in_stack_000001b0,in_stack_000001a8);
    }
  }
  fprintf(in_RDI,"#0\n\n\n\n");
  return;
}

Assistant:

void save_objects(FILE *fp, AREA_DATA *pArea)
{
	OBJ_INDEX_DATA *pObj;

	fprintf(fp, "#OBJS\n");

	for (int i = pArea->min_vnum; i <= pArea->max_vnum; i++)
	{
		if ((pObj = get_obj_index(i)))
			save_object(fp, pObj);
	}

	fprintf(fp, "#0\n\n\n\n");
}